

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

QString * __thiscall QDir::canonicalPath(QString *__return_storage_ptr__,QDir *this)

{
  FileCache *this_00;
  __pointer_type copy;
  QDirPrivate *pQVar1;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var2;
  long in_FS_OFFSET;
  bool bVar3;
  QFileSystemEntry answer;
  undefined1 local_58 [56];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d.ptr;
  _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
       (pQVar1->fileEngine)._M_t.
       super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
       super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
       super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
  if (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl !=
      (QAbstractFileEngine *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl +
                  200))(__return_storage_ptr__,
                        _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,6);
      return __return_storage_ptr__;
    }
    goto LAB_002252e6;
  }
  this_00 = &pQVar1->fileCache;
  if ((__pointer_type)(pQVar1->fileCache).mutex.super_QBasicMutex.d_ptr._q_value._M_b ==
      (__pointer_type)0x0) {
    LOCK();
    bVar3 = (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar3) {
      (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar3) goto LAB_002251e6;
  }
  else {
LAB_002251e6:
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
  local_58._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEngine::canonicalName
            ((QFileSystemEntry *)local_58,&pQVar1->dirEntry,&(pQVar1->fileCache).metaData);
  QFileSystemEntry::filePath(__return_storage_ptr__,(QFileSystemEntry *)local_58);
  if ((QArrayData *)local_58._24_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._24_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._24_8_,1,0x10);
    }
  }
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  LOCK();
  copy = (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
LAB_002252e6:
  __stack_chk_fail();
}

Assistant:

QString QDir::canonicalPath() const
{
    Q_D(const QDir);
    if (!d->fileEngine) {
        QMutexLocker locker(&d->fileCache.mutex);
        QFileSystemEntry answer =
                QFileSystemEngine::canonicalName(d->dirEntry, d->fileCache.metaData);
        return answer.filePath();
    }
    return d->fileEngine->fileName(QAbstractFileEngine::CanonicalName);
}